

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O1

ElementTypeAndOffset * __thiscall
choc::value::Type::Object::getElementInfo
          (ElementTypeAndOffset *__return_storage_ptr__,Object *this,uint32_t index)

{
  Content *pCVar1;
  undefined8 *puVar2;
  byte bVar3;
  MainType MVar4;
  int iVar5;
  MemberNameAndType *pMVar6;
  ComplexArray *other;
  Object *other_00;
  undefined8 uVar7;
  size_t sVar8;
  undefined8 *puVar9;
  Object *this_00;
  ulong uVar10;
  size_t sVar11;
  long lVar12;
  
  if ((this->members).size != 0) {
    lVar12 = 0x20;
    uVar10 = 0;
    sVar11 = 0;
    do {
      pMVar6 = (this->members).items;
      if (index == uVar10) {
        puVar2 = (undefined8 *)((long)&(pMVar6->name)._M_len + lVar12);
        puVar9 = puVar2 + -1;
        MVar4 = *(MainType *)(puVar2 + -2);
        pCVar1 = &(__return_storage_ptr__->elementType).content;
        (__return_storage_ptr__->elementType).mainType = MVar4;
        (__return_storage_ptr__->elementType).content.object = (Object *)0x0;
        (__return_storage_ptr__->elementType).allocator = (Allocator *)0x0;
        if (MVar4 == object) {
          other_00 = (Object *)*puVar9;
          this_00 = (Object *)malloc(0x28);
          Object(this_00,(Allocator *)0x0,other_00);
        }
        else {
          if (MVar4 != complexArray) {
            uVar7 = *puVar2;
            pCVar1->object = (Object *)*puVar9;
            *(undefined8 *)((long)&(__return_storage_ptr__->elementType).content + 8) = uVar7;
            goto LAB_001cb85a;
          }
          other = (ComplexArray *)*puVar9;
          this_00 = (Object *)malloc(0x18);
          ComplexArray::ComplexArray((ComplexArray *)this_00,(Allocator *)0x0,other);
        }
        pCVar1->complexArray = (ComplexArray *)this_00;
LAB_001cb85a:
        __return_storage_ptr__->offset = sVar11;
        return __return_storage_ptr__;
      }
      bVar3 = *(byte *)((long)pMVar6 + lVar12 + -0x10);
      sVar8 = 4;
      if (bVar3 < 0x24) {
        switch(bVar3) {
        case 0:
          sVar8 = 0;
          break;
        case 1:
          sVar8 = 1;
          break;
        case 2:
        case 3:
        case 5:
        case 6:
        case 7:
switchD_001cb722_caseD_2:
          throwError("Invalid type");
        case 4:
          break;
        case 8:
switchD_001cb722_caseD_8:
          sVar8 = 8;
          break;
        default:
          if (bVar3 != 0x14) {
            if (bVar3 != 0x18) goto switchD_001cb722_caseD_2;
            goto switchD_001cb722_caseD_8;
          }
        }
      }
      else if (bVar3 < 0x40) {
        if (bVar3 != 0x24) {
          if (bVar3 != 0x30) goto switchD_001cb722_caseD_2;
          sVar8 = (ulong)*(uint *)((long)pMVar6 + lVar12 + -4) *
                  (ulong)(*(byte *)((long)pMVar6 + lVar12 + -8) & 0xf);
        }
      }
      else if (bVar3 == 0x40) {
        iVar5 = *(int *)((long)&(pMVar6->name)._M_len + lVar12);
        sVar8 = (ulong)*(uint *)((long)pMVar6 + lVar12 + -4) *
                (ulong)((iVar5 + (uint)(iVar5 == 0)) * (*(byte *)((long)pMVar6 + lVar12 + -8) & 0xf)
                       );
      }
      else if (bVar3 == 0x80) {
        sVar8 = ComplexArray::getValueDataSize(*(ComplexArray **)((long)pMVar6 + lVar12 + -8));
      }
      else {
        if (bVar3 != 0x90) goto switchD_001cb722_caseD_2;
        sVar8 = getValueDataSize(*(Object **)((long)pMVar6 + lVar12 + -8));
      }
      sVar11 = sVar11 + sVar8;
      uVar10 = uVar10 + 1;
      lVar12 = lVar12 + 0x30;
    } while (uVar10 < (this->members).size);
  }
  throwError("Index out of range");
}

Assistant:

ElementTypeAndOffset getElementInfo (uint32_t index) const
    {
        size_t offset = 0;

        for (uint32_t i = 0; i < members.size; ++i)
        {
            if (i == index)
                return { members[i].type, offset };

            offset += members[i].type.getValueDataSize();
        }

        throwError ("Index out of range");
    }